

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_color_sinks-inl.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::stderr_color_st<spdlog::synchronous_factory>(string *logger_name,color_mode mode)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  color_mode *unaff_retaddr;
  string *in_stack_00000008;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  synchronous_factory::
  create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            (in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stderr_color_st(const std::string &logger_name,
                                                      color_mode mode) {
    return Factory::template create<sinks::stderr_color_sink_st>(logger_name, mode);
}